

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O2

void StringTestMain(void)

{
  uint uVar1;
  CMyString *CS;
  char *pcVar2;
  CMyString *CS_00;
  CMyString CStack_428;
  
  CS = (CMyString *)malloc(0x408);
  InitCMyString(CS,"hello");
  pcVar2 = GetS(CS);
  printf("After initCMyString, the string is:%s\n",pcVar2);
  CS_00 = (CMyString *)malloc(0x408);
  InitCMyString(CS_00,"World.");
  Concatenate(CS,CS_00);
  pcVar2 = GetS(CS);
  printf("After concatenate, the string is:%s\n",pcVar2);
  InitCMyString(CS_00,"NUDT.");
  InsertS(CS,5,CS_00);
  pcVar2 = GetS(CS);
  printf("After inserting to the pos 5, the string is:%s\n",pcVar2);
  DeleteS(CS,10,6);
  pcVar2 = GetS(CS);
  printf("After deleting the substring(pos:10,len:6),the string is:%s\n",pcVar2);
  SubString(&CStack_428,CS,5,4);
  memcpy(CS_00,&CStack_428,0x408);
  pcVar2 = GetS(CS_00);
  printf("The substring(pos:5,len:4) is:%s\n",pcVar2);
  InitCMyString(CS_00,"NUDT");
  uVar1 = Find(CS,CS_00);
  printf("The First occurrence of string NUDT is the pos %d\n",(ulong)uVar1);
  return;
}

Assistant:

void StringTestMain()
{
    CMyString *CS = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(CS,(char*)"hello");
    printf("After initCMyString, the string is:%s\n",GetS(CS));
    CMyString *tmp = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(tmp,(char*)"World.");
    Concatenate(CS,tmp);
    printf("After concatenate, the string is:%s\n",GetS(CS));
    InitCMyString(tmp,(char*)"NUDT.");
    InsertS(CS,5,tmp);
    printf("After inserting to the pos 5, the string is:%s\n",GetS(CS));
    DeleteS(CS,10,6);
    printf("After deleting the substring(pos:10,len:6),the string is:%s\n",GetS(CS));
    *tmp = SubString(CS,5,4);
    printf("The substring(pos:5,len:4) is:%s\n",GetS(tmp));
    InitCMyString(tmp,(char*)"NUDT");
    printf("The First occurrence of string NUDT is the pos %d\n",Find(CS,tmp));
}